

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>>>
               (tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>
                *matcher_tuple,tuple<mp::expr::Kind,_BasicTestExpr<1>_> *value_tuple)

{
  bool bVar1;
  bool bVar2;
  tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_> *in_RSI;
  MatcherBase<BasicTestExpr<1>_> *in_stack_00000008;
  BasicTestExpr<1> in_stack_00000014;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>>>
                    (in_RSI,(tuple<mp::expr::Kind,_BasicTestExpr<1>_> *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  bVar2 = false;
  if (bVar1) {
    std::get<1ul,testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>>
              ((tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_> *)
               0x1bbc16);
    std::get<1ul,mp::expr::Kind,BasicTestExpr<1>>
              ((tuple<mp::expr::Kind,_BasicTestExpr<1>_> *)0x1bbc25);
    bVar2 = MatcherBase<BasicTestExpr<1>_>::Matches(in_stack_00000008,in_stack_00000014);
  }
  return bVar2;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }